

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void prvTidyReportNumWarnings(TidyDocImpl *doc)

{
  TidyDocImpl *doc_local;
  
  if ((doc->warnings == 0) && (doc->errors == 0)) {
    prvTidyDialogue(doc,0x21d);
  }
  else if (((doc->config).value[0x49].v < (ulong)doc->errors) ||
          ((int)(doc->config).value[0x4e].v == 0)) {
    prvTidyDialogue(doc,0x21e);
  }
  else {
    prvTidyDialogue(doc,0x21b);
  }
  return;
}

Assistant:

void TY_(ReportNumWarnings)( TidyDocImpl* doc )
{
    if ( doc->warnings > 0 || doc->errors > 0 )
    {
        if ( doc->errors > cfg(doc, TidyShowErrors) || !cfgBool(doc, TidyShowWarnings) )
        {
            TY_(Dialogue)( doc, STRING_NOT_ALL_SHOWN );
        }
        else
        {
            TY_(Dialogue)( doc, STRING_ERROR_COUNT );
        }

    }
    else
    {
        TY_(Dialogue)( doc, STRING_NO_ERRORS );
    }
}